

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_signed_char_&,_const_int_&> * __thiscall
Catch::ExprLhs<signed_char_const&>::operator==
          (BinaryExpr<const_signed_char_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<signed_char_const&> *this,int *rhs)

{
  char *lhs;
  bool comparisonResult;
  StringRef local_30;
  int *local_20;
  int *rhs_local;
  ExprLhs<const_signed_char_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (int *)this;
  this_local = (ExprLhs<const_signed_char_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<signed_char,int>(*(char **)this,rhs);
  lhs = *(char **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_signed_char_&,_const_int_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }